

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSmartListTest_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldSmartListTest_Test *this)

{
  RepeatedField<int> *pRVar1;
  bool bVar2;
  void *pvVar3;
  pointer *__ptr;
  char *pcVar4;
  char *in_R9;
  string diff_report;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_398;
  Message local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  AssertHelper local_380;
  undefined1 local_378 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  string local_358;
  undefined1 local_338 [112];
  RepeatedPtrFieldBase local_2c8 [3];
  undefined1 local_280 [112];
  RepeatedPtrFieldBase local_210 [3];
  MessageDifferencer local_1c8;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_280,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_338,(Arena *)0x0);
  pRVar1 = (RepeatedField<int> *)(local_280 + 0x60);
  RepeatedField<int>::Add(pRVar1,1);
  RepeatedField<int>::Add(pRVar1,2);
  RepeatedField<int>::Add(pRVar1,3);
  RepeatedField<int>::Add(pRVar1,9);
  RepeatedField<int>::Add(pRVar1,4);
  RepeatedField<int>::Add(pRVar1,5);
  RepeatedField<int>::Add(pRVar1,7);
  RepeatedField<int>::Add(pRVar1,2);
  pRVar1 = (RepeatedField<int> *)(local_338 + 0x60);
  RepeatedField<int>::Add(pRVar1,9);
  RepeatedField<int>::Add(pRVar1,0);
  RepeatedField<int>::Add(pRVar1,2);
  RepeatedField<int>::Add(pRVar1,7);
  RepeatedField<int>::Add(pRVar1,3);
  RepeatedField<int>::Add(pRVar1,4);
  RepeatedField<int>::Add(pRVar1,5);
  RepeatedField<int>::Add(pRVar1,6);
  RepeatedField<int>::Add(pRVar1,2);
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  util::MessageDifferencer::MessageDifferencer(&local_1c8);
  util::MessageDifferencer::ReportDifferencesToString(&local_1c8,&local_358);
  util::MessageDifferencer::set_repeated_field_comparison(&local_1c8,AS_SMART_LIST);
  bVar2 = util::MessageDifferencer::Compare(&local_1c8,(Message *)local_280,(Message *)local_338);
  local_390.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar2;
  local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_378,(internal *)&local_390,(AssertionResult *)0x122213d,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x613,(char *)CONCAT71(local_378._1_7_,local_378[0]));
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_378._1_7_,local_378[0]),local_368._M_allocated_capacity + 1)
      ;
    }
    if (local_398._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_398._M_head_impl + 8))();
    }
    if (local_388 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_388,local_388);
    }
  }
  testing::internal::CmpHelperEQ<char[249],std::__cxx11::string>
            ((internal *)local_378,
             "\"deleted: rv[0]: 1\\n\" \"added: rv[0]: 9\\n\" \"added: rv[1]: 0\\n\" \"moved: rv[1] -> rv[2] : 2\\n\" \"added: rv[3]: 7\\n\" \"moved: rv[2] -> rv[4] : 3\\n\" \"deleted: rv[3]: 9\\n\" \"moved: rv[4] -> rv[5] : 4\\n\" \"moved: rv[5] -> rv[6] : 5\\n\" \"deleted: rv[6]: 7\\n\" \"added: rv[7]: 6\\n\" \"moved: rv[7] -> rv[8] : 2\\n\""
             ,"diff_report",
             (char (*) [249])
             "deleted: rv[0]: 1\nadded: rv[0]: 9\nadded: rv[1]: 0\nmoved: rv[1] -> rv[2] : 2\nadded: rv[3]: 7\nmoved: rv[2] -> rv[4] : 3\ndeleted: rv[3]: 9\nmoved: rv[4] -> rv[5] : 4\nmoved: rv[5] -> rv[6] : 5\ndeleted: rv[6]: 7\nadded: rv[7]: 6\nmoved: rv[7] -> rv[8] : 2\n"
             ,&local_358);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message(&local_390);
    if (local_370 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_370->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x621,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_398);
    if ((long *)CONCAT71(local_390.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_390.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_390.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_390.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_370 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_370,local_370);
  }
  proto2_unittest::TestDiffMessage::Clear((TestDiffMessage *)local_280);
  proto2_unittest::TestDiffMessage::Clear((TestDiffMessage *)local_338);
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_210,Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x4c) = 1;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 4;
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_210,Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x4c) = 2;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 4;
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_210,Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x4c) = 3;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 4;
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_210,Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x4c) = 4;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 4;
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_210,Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x4c) = 5;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 4;
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_2c8,Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x4c) = 2;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 4;
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_2c8,Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x4c) = 6;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 4;
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_2c8,Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x4c) = 4;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 4;
  util::MessageDifferencer::ReportDifferencesToString(&local_1c8,&local_358);
  util::MessageDifferencer::set_repeated_field_comparison(&local_1c8,AS_SMART_LIST);
  bVar2 = util::MessageDifferencer::Compare(&local_1c8,(Message *)local_280,(Message *)local_338);
  local_390.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar2;
  local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_378,(internal *)&local_390,(AssertionResult *)0x122213d,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x633,(char *)CONCAT71(local_378._1_7_,local_378[0]));
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_378._1_7_,local_378[0]),local_368._M_allocated_capacity + 1)
      ;
    }
    if (local_398._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_398._M_head_impl + 8))();
    }
    if (local_388 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_388,local_388);
    }
  }
  testing::internal::CmpHelperEQ<char[165],std::__cxx11::string>
            ((internal *)local_378,
             "\"deleted: rm[0]: { a: 1 }\\n\" \"moved: rm[1] -> rm[0] : { a: 2 }\\n\" \"deleted: rm[2]: { a: 3 }\\n\" \"added: rm[1]: { a: 6 }\\n\" \"moved: rm[3] -> rm[2] : { a: 4 }\\n\" \"deleted: rm[4]: { a: 5 }\\n\""
             ,"diff_report",
             (char (*) [165])
             "deleted: rm[0]: { a: 1 }\nmoved: rm[1] -> rm[0] : { a: 2 }\ndeleted: rm[2]: { a: 3 }\nadded: rm[1]: { a: 6 }\nmoved: rm[3] -> rm[2] : { a: 4 }\ndeleted: rm[4]: { a: 5 }\n"
             ,&local_358);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message(&local_390);
    if (local_370 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_370->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x63b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_398);
    if ((long *)CONCAT71(local_390.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_390.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_390.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_390.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_370 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_370,local_370);
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,
                    CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                             local_358.field_2._M_local_buf[0]) + 1);
  }
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_338);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_280);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSmartListTest) {
  // Create the testing protos
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  msg1.add_rv(1);
  msg1.add_rv(2);
  msg1.add_rv(3);
  msg1.add_rv(9);
  msg1.add_rv(4);
  msg1.add_rv(5);
  msg1.add_rv(7);
  msg1.add_rv(2);
  msg2.add_rv(9);
  msg2.add_rv(0);
  msg2.add_rv(2);
  msg2.add_rv(7);
  msg2.add_rv(3);
  msg2.add_rv(4);
  msg2.add_rv(5);
  msg2.add_rv(6);
  msg2.add_rv(2);
  // Compare
  // a: 1,      2,    3, 9, 4, 5, 7,   2
  // b:   9, 0, 2, 7, 3,    4, 5,   6, 2
  std::string diff_report;
  util::MessageDifferencer differencer;
  differencer.ReportDifferencesToString(&diff_report);
  differencer.set_repeated_field_comparison(
      util::MessageDifferencer::AS_SMART_LIST);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "deleted: rv[0]: 1\n"
      "added: rv[0]: 9\n"
      "added: rv[1]: 0\n"
      "moved: rv[1] -> rv[2] : 2\n"
      "added: rv[3]: 7\n"
      "moved: rv[2] -> rv[4] : 3\n"
      "deleted: rv[3]: 9\n"
      "moved: rv[4] -> rv[5] : 4\n"
      "moved: rv[5] -> rv[6] : 5\n"
      "deleted: rv[6]: 7\n"
      "added: rv[7]: 6\n"
      "moved: rv[7] -> rv[8] : 2\n",
      diff_report);

  // Compare two sub messages
  // a: 1, 2, 3,    4, 5
  // b:    2,    6, 4,
  msg1.Clear();
  msg2.Clear();
  msg1.add_rm()->set_a(1);
  msg1.add_rm()->set_a(2);
  msg1.add_rm()->set_a(3);
  msg1.add_rm()->set_a(4);
  msg1.add_rm()->set_a(5);
  msg2.add_rm()->set_a(2);
  msg2.add_rm()->set_a(6);
  msg2.add_rm()->set_a(4);
  differencer.ReportDifferencesToString(&diff_report);
  differencer.set_repeated_field_comparison(
      util::MessageDifferencer::AS_SMART_LIST);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "deleted: rm[0]: { a: 1 }\n"
      "moved: rm[1] -> rm[0] : { a: 2 }\n"
      "deleted: rm[2]: { a: 3 }\n"
      "added: rm[1]: { a: 6 }\n"
      "moved: rm[3] -> rm[2] : { a: 4 }\n"
      "deleted: rm[4]: { a: 5 }\n",
      diff_report);
}